

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImGuiTextBuffer::ImGuiTextBuffer(ImGuiTextBuffer *this)

{
  char *__src;
  char *__dest;
  
  (this->Buf).Size = 0;
  (this->Buf).Capacity = 0;
  (this->Buf).Data = (char *)0x0;
  if ((this->Buf).Capacity == 0) {
    __dest = (char *)ImGui::MemAlloc(8);
    __src = (this->Buf).Data;
    if (__src != (char *)0x0) {
      memcpy(__dest,__src,(long)(this->Buf).Size);
    }
    ImGui::MemFree((this->Buf).Data);
    (this->Buf).Data = __dest;
    (this->Buf).Capacity = 8;
  }
  (this->Buf).Data[(this->Buf).Size] = '\0';
  (this->Buf).Size = (this->Buf).Size + 1;
  return;
}

Assistant:

ImGuiTextBuffer()   { Buf.push_back(0); }